

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int median(int a,int b,int c)

{
  int c_local;
  int b_local;
  int a_local;
  
  if (b < a) {
    b_local = a;
    if ((c < a) && (b_local = b, b <= c)) {
      b_local = c;
    }
  }
  else {
    b_local = b;
    if ((c < b) && (b_local = a, a <= c)) {
      b_local = c;
    }
  }
  return b_local;
}

Assistant:

static int
median(int a, int b, int c)
{
    if (a <= b) {
        if (b <= c) return b;
        if (a <= c) return c;
        return a;
    }
    else {
        if (a <= c) return a;
        if (b <= c) return c;
        return b;
    }
}